

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportConfig(cmExportFileGenerator *this,ostream *os,string *config)

{
  ulong uVar1;
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string suffix;
  string *config_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  suffix.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"_",&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_78,(string *)suffix.field_2._8_8_);
    std::__cxx11::string::operator+=(local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::operator+=(local_40,"NOCONFIG");
  }
  (*this->_vptr_cmExportFileGenerator[0xd])(this,os,suffix.field_2._8_8_,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportConfig(std::ostream& os,
                                                 const std::string& config)
{
  // Construct the property configuration suffix.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // Generate the per-config target information.
  this->GenerateImportTargetsConfig(os, config, suffix);
}